

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_watcher.hpp
# Opt level: O3

void __thiscall
vfs::posix_watcher::posix_watcher(posix_watcher *this,path *dir,callback_t *callback)

{
  pointer pcVar1;
  
  (this->running_)._M_base._M_i = false;
  (this->dir_).pathStr_._M_dataplus._M_p = (pointer)&(this->dir_).pathStr_.field_2;
  pcVar1 = (dir->pathStr_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->dir_,pcVar1,pcVar1 + (dir->pathStr_)._M_string_length);
  this->inotifyFd_ = -1;
  std::function<void_(const_vfs::path_&)>::function(&this->callback_,callback);
  (this->thread_)._M_id._M_thread = 0;
  std::condition_variable::condition_variable(&this->cv_);
  (this->cvMutex_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0
  ;
  *(undefined8 *)((long)&(this->cvMutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->cvMutex_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0
  ;
  (this->cvMutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->cvMutex_).super___mutex_base._M_mutex + 8) = 0;
  this->waitTimeoutInMs_ = 0xffffffffffffffff;
  return;
}

Assistant:

posix_watcher(const path &dir, const callback_t &callback)
            : running_(false)
            , dir_(dir)
            , callback_(callback)
            , inotifyFd_(-1)
            , waitTimeoutInMs_(std::numeric_limits<uint64_t>::max())
        {}